

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

ostream * wasm::anon_unknown_0::printLocal(Index index,Function *func,ostream *o)

{
  bool bVar1;
  ostream *poVar2;
  string_view local_50;
  string_view local_40;
  undefined1 local_30 [8];
  Name name;
  ostream *o_local;
  Function *func_local;
  Index index_local;
  
  name.super_IString.str._M_str = (char *)o;
  wasm::Name::Name((Name *)local_30);
  if (func != (Function *)0x0) {
    local_40 = (string_view)Function::getLocalNameOrDefault(func,index);
    wasm::Name::operator=((Name *)local_30,(Name *)&local_40);
  }
  bVar1 = IString::operator_cast_to_bool((IString *)local_30);
  if (!bVar1) {
    local_50 = (string_view)wasm::Name::fromInt((ulong)index);
    wasm::Name::operator=((Name *)local_30,(Name *)&local_50);
  }
  poVar2 = wasm::Name::print((Name *)local_30,(ostream *)name.super_IString.str._M_str);
  return poVar2;
}

Assistant:

std::ostream& printLocal(Index index, Function* func, std::ostream& o) {
  Name name;
  if (func) {
    name = func->getLocalNameOrDefault(index);
  }
  if (!name) {
    name = Name::fromInt(index);
  }
  return name.print(o);
}